

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

void __thiscall MobileElementManager::Delete(MobileElementManager *this,int index)

{
  int iVar1;
  pointer pdVar2;
  runtime_error *this_00;
  pointer pdVar3;
  pointer __src;
  long lVar4;
  
  lVar4 = (long)index;
  this->prop_sum_ =
       this->prop_sum_ -
       (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[lVar4];
  iVar1 = std::__cxx11::string::compare
                    ((char *)((long)(this->polymerases_).
                                    super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar4].first.
                                    super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr + 0x18));
  if (iVar1 != 0) {
    this->pol_count_ = this->pol_count_ + -1;
  }
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::_M_erase(&this->polymerases_,
             (this->polymerases_).
             super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4);
  pdVar2 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __src = pdVar2 + lVar4 + 1;
  if (__src != pdVar3) {
    memmove(pdVar2 + lVar4,__src,(long)pdVar3 - (long)__src);
    pdVar2 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar3 + -1;
  if ((long)(pdVar3 + -1) - (long)pdVar2 >> 3 ==
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Prop list not correct size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Delete(int index) {
  prop_sum_ -= prop_list_[index];
  // Keep running count of non-RNAse mobile elements
  if (polymerases_[index].first->name() != "__rnase") {
    pol_count_ -= 1;
  }
  polymerases_.erase(polymerases_.begin() + index);
  prop_list_.erase(prop_list_.begin() + index);
  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
}